

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_upsample_intra_edge_c(uint8_t *p,int sz)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint8_t in [19];
  byte local_38 [32];
  
  local_38[0] = p[-1];
  local_38[1] = p[-1];
  if (0 < sz) {
    memcpy(local_38 + 2,p,(ulong)(uint)sz);
  }
  local_38[(long)sz + 2] = p[(long)sz + -1];
  p[-2] = local_38[0];
  if (0 < sz) {
    uVar2 = 0;
    do {
      bVar1 = local_38[uVar2 + 2];
      iVar3 = (int)((((uint)local_38[uVar2 + 1] + (uint)bVar1) * 9 -
                    ((uint)local_38[uVar2 + 3] + (uint)local_38[uVar2])) + 8) >> 4;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      p[uVar2 * 2 + -1] = (uint8_t)iVar3;
      p[uVar2 * 2] = bVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)sz != uVar2);
  }
  return;
}

Assistant:

void av1_upsample_intra_edge_c(uint8_t *p, int sz) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint8_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = clip_pixel((s + 8) >> 4);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}